

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O0

void Ssw_FrmStop(Ssw_Frm_t *p)

{
  Ssw_Frm_t *p_local;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pFrames);
  }
  Vec_PtrFree(p->vAig2Frm);
  if (p != (Ssw_Frm_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ssw_FrmStop( Ssw_Frm_t * p )
{
    if ( p->pFrames )
        Aig_ManStop( p->pFrames );
    Vec_PtrFree( p->vAig2Frm );
    ABC_FREE( p );
}